

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolo-image.cpp
# Opt level: O0

void embed_image(yolo_image *source,yolo_image *dest,int dx,int dy)

{
  int in_ECX;
  int in_EDX;
  yolo_image *in_RSI;
  int *in_RDI;
  float val;
  int x;
  int y;
  int k;
  float in_stack_ffffffffffffffd8;
  int x_00;
  float val_00;
  int c;
  
  for (c = 0; c < in_RDI[2]; c = c + 1) {
    for (val_00 = 0.0; (int)val_00 < in_RDI[1]; val_00 = (float)((int)val_00 + 1)) {
      for (x_00 = 0; x_00 < *in_RDI; x_00 = x_00 + 1) {
        in_stack_ffffffffffffffd8 =
             yolo_image::get_pixel
                       ((yolo_image *)CONCAT44(c,val_00),x_00,(int)in_stack_ffffffffffffffd8,0);
        yolo_image::set_pixel(in_RSI,in_EDX,in_ECX,c,val_00);
      }
    }
  }
  return;
}

Assistant:

static void embed_image(const yolo_image & source, yolo_image & dest, int dx, int dy)
{
    for (int k = 0; k < source.c; ++k) {
        for (int y = 0; y < source.h; ++y) {
            for (int x = 0; x < source.w; ++x) {
                float val = source.get_pixel(x, y, k);
                dest.set_pixel(dx+x, dy+y, k, val);
            }
        }
    }
}